

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

bool __thiscall
cmOrderDirectoriesConstraint::FileMayConflict
          (cmOrderDirectoriesConstraint *this,string *dir,string *name)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar2;
  string file;
  
  std::__cxx11::string::string((string *)&file,(string *)dir);
  std::__cxx11::string::append((char *)&file);
  std::__cxx11::string::append((string *)&file);
  bVar1 = cmsys::SystemTools::FileExists(file._M_dataplus._M_p,true);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::SameFile(&this->FullPath,&file);
    bVar1 = !bVar1;
  }
  else {
    this_00 = &cmGlobalGenerator::GetDirectoryContent(this->GlobalGenerator,dir,false)->_M_t;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(this_00,name);
    bVar1 = (_Rb_tree_header *)cVar2._M_node != &(this_00->_M_impl).super__Rb_tree_header;
  }
  std::__cxx11::string::~string((string *)&file);
  return bVar1;
}

Assistant:

bool cmOrderDirectoriesConstraint::FileMayConflict(std::string const& dir,
                                                   std::string const& name)
{
  // Check if the file exists on disk.
  std::string file = dir;
  file += "/";
  file += name;
  if(cmSystemTools::FileExists(file.c_str(), true))
    {
    // The file conflicts only if it is not the same as the original
    // file due to a symlink or hardlink.
    return !cmSystemTools::SameFile(this->FullPath, file);
    }

  // Check if the file will be built by cmake.
  std::set<std::string> const& files =
    (this->GlobalGenerator->GetDirectoryContent(dir, false));
  std::set<std::string>::const_iterator fi = files.find(name);
  return fi != files.end();
}